

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

Vec3f __thiscall TRM::Model::normal(Model *this,Vec2f uvf)

{
  int iVar1;
  int iVar2;
  uchar auVar3 [4];
  TGAColor TVar4;
  float *pfVar5;
  length_type i;
  TGAImage *this_00;
  long lVar6;
  float fVar7;
  TGAColor c;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_48;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_44;
  Vec3f res;
  
  this_00 = &this->normalmap_;
  iVar1 = TGAImage::get_width(this_00);
  local_48 = uvf.field_0;
  aStack_44 = uvf.field_1;
  iVar2 = TGAImage::get_height(this_00);
  TVar4 = TGAImage::get(this_00,(int)((float)iVar1 * local_48.x),(int)((float)iVar2 * aStack_44.y));
  auVar3 = TVar4.bgra;
  c.bgra[0] = auVar3[0];
  c.bgra[1] = auVar3[1];
  c.bgra[2] = auVar3[2];
  c.bgra[3] = auVar3[3];
  c.bytespp = TVar4.bytespp;
  i = 2;
  for (lVar6 = -3; lVar6 != 0; lVar6 = lVar6 + 1) {
    fVar7 = (float)c.bgra[lVar6 + 3] / 255.0;
    pfVar5 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&res,i);
    *pfVar5 = fVar7 + fVar7 + -1.0;
    i = i + -1;
  }
  return res;
}

Assistant:

Vec3f Model::normal(Vec2f uvf) {
  Vec2i uv;
  uv[0] = uvf[0] * normalmap_.get_width();
  uv[1] = uvf[1] * normalmap_.get_height();
  TGAColor c = normalmap_.get(uv[0], uv[1]);
  Vec3f res;
  for (int i = 0; i < 3; i++) res[2 - i] = (float)c[i] / 255.f * 2.f - 1.f;
  return res;
}